

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O1

int smf_track_add_eot_delta_pulses(smf_track_t *track,int delta)

{
  smf_event_t *event;
  int iVar1;
  
  iVar1 = 0;
  event = smf_event_new_from_bytes(0xff,0x2f,0);
  if (event == (smf_event_t *)0x0) {
    iVar1 = -1;
  }
  else {
    smf_track_add_event_delta_pulses(track,event,delta);
  }
  return iVar1;
}

Assistant:

int
smf_track_add_eot_delta_pulses(smf_track_t *track, int delta)
{
	smf_event_t *event;

	event = smf_event_new_from_bytes(0xFF, 0x2F, 0x00);
	if (event == NULL)
		return (-1);

	smf_track_add_event_delta_pulses(track, event, delta);

	return (0);
}